

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

uint64_t roaring64_bitmap_maximum(roaring64_bitmap_t *r)

{
  art_key_chunk_t aVar1;
  ushort uVar2;
  long lVar3;
  ulong uVar4;
  bitset_container_t *container;
  art_iterator_t it;
  art_iterator_t local_98;
  
  art_init_iterator(&local_98,&r->art,false);
  if (local_98.value == (art_val_t *)0x0) {
    return 0;
  }
  container = *(bitset_container_t **)(local_98.value[1].key + 2);
  aVar1 = local_98.value[1].key[0];
  if (aVar1 == '\x04') {
    aVar1 = *(art_key_chunk_t *)&container->words;
    container = *(bitset_container_t **)container;
  }
  if (aVar1 == '\x03') {
    lVar3 = (long)container->cardinality;
    if (lVar3 != 0) {
      uVar2 = *(short *)((long)container->words + lVar3 * 4 + -2) +
              *(short *)((long)container->words + lVar3 * 4 + -4);
      goto LAB_0010b219;
    }
  }
  else {
    if (aVar1 != '\x02') {
      uVar2 = bitset_container_maximum(container);
      goto LAB_0010b219;
    }
    if ((long)container->cardinality != 0) {
      uVar2 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
      goto LAB_0010b219;
    }
  }
  uVar2 = 0;
LAB_0010b219:
  uVar4 = (ulong)CONCAT24(local_98.key._4_2_,local_98.key._0_4_);
  return (ulong)uVar2 |
         ((ulong)(ushort)local_98.key._4_2_ << 0x20 & 0xff0000000000) >> 0x18 |
         ((ulong)(ushort)local_98.key._4_2_ << 0x20 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8
         | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
}

Assistant:

uint64_t roaring64_bitmap_maximum(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/false);
    if (it.value == NULL) {
        return 0;
    }
    leaf_t *leaf = (leaf_t *)it.value;
    return combine_key(it.key,
                       container_maximum(leaf->container, leaf->typecode));
}